

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  uint uVar42;
  undefined1 (*pauVar43) [16];
  undefined4 uVar44;
  ulong uVar45;
  long lVar46;
  Geometry *pGVar47;
  ulong uVar48;
  long lVar49;
  Scene *pSVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [16];
  ulong uVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar64;
  float fVar65;
  undefined1 auVar63 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [64];
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar95 [64];
  uint uVar101;
  uint uVar102;
  uint uVar103;
  undefined1 auVar100 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  float fVar107;
  float fVar113;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  undefined1 auVar110 [64];
  float fVar114;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2684;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  RayQueryContext *local_2648;
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  Geometry *local_2618;
  long local_2610;
  long local_2608;
  RTCFilterFunctionNArguments local_2600;
  float local_25d0;
  undefined4 local_25cc;
  undefined4 local_25c8;
  float local_25c4;
  float local_25c0;
  undefined4 local_25bc;
  uint local_25b8;
  uint local_25b4;
  uint local_25b0;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2510 [16];
  float local_2500 [4];
  float local_24f0 [4];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined8 local_24b0;
  undefined8 uStack_24a8;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2648 = context;
    pauVar54 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar67 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar89._8_4_ = 0x7fffffff;
    auVar89._0_8_ = 0x7fffffff7fffffff;
    auVar89._12_4_ = 0x7fffffff;
    auVar89 = vandps_avx((undefined1  [16])aVar2,auVar89);
    auVar90._8_4_ = 0x219392ef;
    auVar90._0_8_ = 0x219392ef219392ef;
    auVar90._12_4_ = 0x219392ef;
    auVar89 = vcmpps_avx(auVar89,auVar90,1);
    auVar89 = vblendvps_avx((undefined1  [16])aVar2,auVar90,auVar89);
    auVar90 = vrcpps_avx(auVar89);
    fVar56 = auVar90._0_4_;
    auVar85._0_4_ = auVar89._0_4_ * fVar56;
    fVar64 = auVar90._4_4_;
    auVar85._4_4_ = auVar89._4_4_ * fVar64;
    fVar65 = auVar90._8_4_;
    auVar85._8_4_ = auVar89._8_4_ * fVar65;
    fVar66 = auVar90._12_4_;
    auVar85._12_4_ = auVar89._12_4_ * fVar66;
    auVar91._8_4_ = 0x3f800000;
    auVar91._0_8_ = 0x3f8000003f800000;
    auVar91._12_4_ = 0x3f800000;
    auVar89 = vsubps_avx(auVar91,auVar85);
    auVar86._0_4_ = fVar56 + fVar56 * auVar89._0_4_;
    auVar86._4_4_ = fVar64 + fVar64 * auVar89._4_4_;
    auVar86._8_4_ = fVar65 + fVar65 * auVar89._8_4_;
    auVar86._12_4_ = fVar66 + fVar66 * auVar89._12_4_;
    uVar44 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar44;
    local_23c0._0_4_ = uVar44;
    local_23c0._8_4_ = uVar44;
    local_23c0._12_4_ = uVar44;
    local_23c0._16_4_ = uVar44;
    local_23c0._20_4_ = uVar44;
    local_23c0._24_4_ = uVar44;
    local_23c0._28_4_ = uVar44;
    auVar93 = ZEXT3264(local_23c0);
    uVar44 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar44;
    local_23e0._0_4_ = uVar44;
    local_23e0._8_4_ = uVar44;
    local_23e0._12_4_ = uVar44;
    local_23e0._16_4_ = uVar44;
    local_23e0._20_4_ = uVar44;
    local_23e0._24_4_ = uVar44;
    local_23e0._28_4_ = uVar44;
    auVar95 = ZEXT3264(local_23e0);
    uVar44 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar44;
    local_2400._0_4_ = uVar44;
    local_2400._8_4_ = uVar44;
    local_2400._12_4_ = uVar44;
    local_2400._16_4_ = uVar44;
    local_2400._20_4_ = uVar44;
    local_2400._24_4_ = uVar44;
    local_2400._28_4_ = uVar44;
    auVar100 = ZEXT3264(local_2400);
    auVar89 = vshufps_avx(auVar86,auVar86,0);
    local_2420._16_16_ = auVar89;
    local_2420._0_16_ = auVar89;
    auVar104 = ZEXT3264(local_2420);
    auVar89 = vmovshdup_avx(auVar86);
    auVar90 = vshufps_avx(auVar86,auVar86,0x55);
    local_2440._16_16_ = auVar90;
    local_2440._0_16_ = auVar90;
    auVar105 = ZEXT3264(local_2440);
    auVar90 = vshufpd_avx(auVar86,auVar86,1);
    auVar85 = vshufps_avx(auVar86,auVar86,0xaa);
    local_2460._16_16_ = auVar85;
    local_2460._0_16_ = auVar85;
    auVar106 = ZEXT3264(local_2460);
    uVar52 = (ulong)(auVar86._0_4_ < 0.0) << 5;
    uVar51 = (ulong)(auVar89._0_4_ < 0.0) << 5 | 0x40;
    uVar48 = (ulong)(auVar90._0_4_ < 0.0) << 5 | 0x80;
    uVar53 = uVar52 ^ 0x20;
    auVar89 = vshufps_avx(auVar67,auVar67,0);
    local_2480._16_16_ = auVar89;
    local_2480._0_16_ = auVar89;
    auVar110 = ZEXT3264(local_2480);
    auVar89 = vshufps_avx(auVar79,auVar79,0);
    auVar63 = ZEXT3264(CONCAT1616(auVar89,auVar89));
    local_2580 = mm_lookupmask_ps._240_8_;
    uStack_2578 = mm_lookupmask_ps._248_8_;
LAB_00e54122:
    if (pauVar54 != (undefined1 (*) [16])&local_23a0) {
      pauVar43 = pauVar54 + -1;
      pauVar54 = pauVar54 + -1;
      if (*(float *)(*pauVar43 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar45 = *(ulong *)*pauVar54;
        while ((uVar45 & 8) == 0) {
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar52),auVar93._0_32_);
          auVar34._4_4_ = auVar104._4_4_ * auVar33._4_4_;
          auVar34._0_4_ = auVar104._0_4_ * auVar33._0_4_;
          auVar34._8_4_ = auVar104._8_4_ * auVar33._8_4_;
          auVar34._12_4_ = auVar104._12_4_ * auVar33._12_4_;
          auVar34._16_4_ = auVar104._16_4_ * auVar33._16_4_;
          auVar34._20_4_ = auVar104._20_4_ * auVar33._20_4_;
          auVar34._24_4_ = auVar104._24_4_ * auVar33._24_4_;
          auVar34._28_4_ = auVar33._28_4_;
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar51),auVar95._0_32_);
          auVar36._4_4_ = auVar105._4_4_ * auVar33._4_4_;
          auVar36._0_4_ = auVar105._0_4_ * auVar33._0_4_;
          auVar36._8_4_ = auVar105._8_4_ * auVar33._8_4_;
          auVar36._12_4_ = auVar105._12_4_ * auVar33._12_4_;
          auVar36._16_4_ = auVar105._16_4_ * auVar33._16_4_;
          auVar36._20_4_ = auVar105._20_4_ * auVar33._20_4_;
          auVar36._24_4_ = auVar105._24_4_ * auVar33._24_4_;
          auVar36._28_4_ = auVar33._28_4_;
          auVar33 = vmaxps_avx(auVar34,auVar36);
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar48),auVar100._0_32_);
          auVar37._4_4_ = auVar106._4_4_ * auVar34._4_4_;
          auVar37._0_4_ = auVar106._0_4_ * auVar34._0_4_;
          auVar37._8_4_ = auVar106._8_4_ * auVar34._8_4_;
          auVar37._12_4_ = auVar106._12_4_ * auVar34._12_4_;
          auVar37._16_4_ = auVar106._16_4_ * auVar34._16_4_;
          auVar37._20_4_ = auVar106._20_4_ * auVar34._20_4_;
          auVar37._24_4_ = auVar106._24_4_ * auVar34._24_4_;
          auVar37._28_4_ = auVar34._28_4_;
          auVar34 = vmaxps_avx(auVar37,auVar110._0_32_);
          local_2560 = vmaxps_avx(auVar33,auVar34);
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + uVar53),auVar93._0_32_);
          auVar38._4_4_ = auVar104._4_4_ * auVar33._4_4_;
          auVar38._0_4_ = auVar104._0_4_ * auVar33._0_4_;
          auVar38._8_4_ = auVar104._8_4_ * auVar33._8_4_;
          auVar38._12_4_ = auVar104._12_4_ * auVar33._12_4_;
          auVar38._16_4_ = auVar104._16_4_ * auVar33._16_4_;
          auVar38._20_4_ = auVar104._20_4_ * auVar33._20_4_;
          auVar38._24_4_ = auVar104._24_4_ * auVar33._24_4_;
          auVar38._28_4_ = auVar33._28_4_;
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + (uVar51 ^ 0x20)),
                               auVar95._0_32_);
          auVar39._4_4_ = auVar105._4_4_ * auVar33._4_4_;
          auVar39._0_4_ = auVar105._0_4_ * auVar33._0_4_;
          auVar39._8_4_ = auVar105._8_4_ * auVar33._8_4_;
          auVar39._12_4_ = auVar105._12_4_ * auVar33._12_4_;
          auVar39._16_4_ = auVar105._16_4_ * auVar33._16_4_;
          auVar39._20_4_ = auVar105._20_4_ * auVar33._20_4_;
          auVar39._24_4_ = auVar105._24_4_ * auVar33._24_4_;
          auVar39._28_4_ = auVar33._28_4_;
          auVar33 = vminps_avx(auVar38,auVar39);
          auVar34 = vsubps_avx(*(undefined1 (*) [32])(uVar45 + 0x40 + (uVar48 ^ 0x20)),
                               auVar100._0_32_);
          auVar40._4_4_ = auVar106._4_4_ * auVar34._4_4_;
          auVar40._0_4_ = auVar106._0_4_ * auVar34._0_4_;
          auVar40._8_4_ = auVar106._8_4_ * auVar34._8_4_;
          auVar40._12_4_ = auVar106._12_4_ * auVar34._12_4_;
          auVar40._16_4_ = auVar106._16_4_ * auVar34._16_4_;
          auVar40._20_4_ = auVar106._20_4_ * auVar34._20_4_;
          auVar40._24_4_ = auVar106._24_4_ * auVar34._24_4_;
          auVar40._28_4_ = auVar34._28_4_;
          auVar34 = vminps_avx(auVar40,auVar63._0_32_);
          auVar33 = vminps_avx(auVar33,auVar34);
          auVar33 = vcmpps_avx(local_2560,auVar33,2);
          uVar42 = vmovmskps_avx(auVar33);
          if (uVar42 == 0) goto LAB_00e54122;
          uVar42 = uVar42 & 0xff;
          uVar55 = uVar45 & 0xfffffffffffffff0;
          lVar46 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
            }
          }
          uVar45 = *(ulong *)(uVar55 + lVar46 * 8);
          uVar42 = uVar42 - 1 & uVar42;
          if (uVar42 != 0) {
            uVar101 = *(uint *)(local_2560 + lVar46 * 4);
            lVar46 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar55 + lVar46 * 8);
            uVar102 = *(uint *)(local_2560 + lVar46 * 4);
            uVar42 = uVar42 - 1 & uVar42;
            if (uVar42 == 0) {
              if (uVar101 < uVar102) {
                *(ulong *)*pauVar54 = uVar5;
                *(uint *)(*pauVar54 + 8) = uVar102;
                pauVar54 = pauVar54 + 1;
              }
              else {
                *(ulong *)*pauVar54 = uVar45;
                *(uint *)(*pauVar54 + 8) = uVar101;
                pauVar54 = pauVar54 + 1;
                uVar45 = uVar5;
              }
            }
            else {
              auVar67._8_8_ = 0;
              auVar67._0_8_ = uVar45;
              auVar89 = vpunpcklqdq_avx(auVar67,ZEXT416(uVar101));
              auVar79._8_8_ = 0;
              auVar79._0_8_ = uVar5;
              auVar67 = vpunpcklqdq_avx(auVar79,ZEXT416(uVar102));
              lVar46 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                }
              }
              auVar87._8_8_ = 0;
              auVar87._0_8_ = *(ulong *)(uVar55 + lVar46 * 8);
              auVar90 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_2560 + lVar46 * 4)));
              auVar79 = vpcmpgtd_avx(auVar67,auVar89);
              uVar42 = uVar42 - 1 & uVar42;
              if (uVar42 == 0) {
                auVar85 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar67,auVar89,auVar85);
                auVar89 = vblendvps_avx(auVar89,auVar67,auVar85);
                auVar67 = vpcmpgtd_avx(auVar90,auVar79);
                auVar85 = vpshufd_avx(auVar67,0xaa);
                auVar67 = vblendvps_avx(auVar90,auVar79,auVar85);
                auVar79 = vblendvps_avx(auVar79,auVar90,auVar85);
                auVar90 = vpcmpgtd_avx(auVar79,auVar89);
                auVar85 = vpshufd_avx(auVar90,0xaa);
                auVar90 = vblendvps_avx(auVar79,auVar89,auVar85);
                auVar89 = vblendvps_avx(auVar89,auVar79,auVar85);
                *pauVar54 = auVar89;
                pauVar54[1] = auVar90;
                uVar45 = auVar67._0_8_;
                pauVar54 = pauVar54 + 2;
              }
              else {
                lVar46 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                  }
                }
                auVar92._8_8_ = 0;
                auVar92._0_8_ = *(ulong *)(uVar55 + lVar46 * 8);
                auVar85 = vpunpcklqdq_avx(auVar92,ZEXT416(*(uint *)(local_2560 + lVar46 * 4)));
                uVar42 = uVar42 - 1 & uVar42;
                uVar45 = (ulong)uVar42;
                if (uVar42 == 0) {
                  auVar86 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar67,auVar89,auVar86);
                  auVar89 = vblendvps_avx(auVar89,auVar67,auVar86);
                  auVar67 = vpcmpgtd_avx(auVar85,auVar90);
                  auVar86 = vpshufd_avx(auVar67,0xaa);
                  auVar67 = vblendvps_avx(auVar85,auVar90,auVar86);
                  auVar90 = vblendvps_avx(auVar90,auVar85,auVar86);
                  auVar85 = vpcmpgtd_avx(auVar90,auVar89);
                  auVar86 = vpshufd_avx(auVar85,0xaa);
                  auVar85 = vblendvps_avx(auVar90,auVar89,auVar86);
                  auVar89 = vblendvps_avx(auVar89,auVar90,auVar86);
                  auVar90 = vpcmpgtd_avx(auVar67,auVar79);
                  auVar86 = vpshufd_avx(auVar90,0xaa);
                  auVar90 = vblendvps_avx(auVar67,auVar79,auVar86);
                  auVar67 = vblendvps_avx(auVar79,auVar67,auVar86);
                  auVar79 = vpcmpgtd_avx(auVar85,auVar67);
                  auVar86 = vpshufd_avx(auVar79,0xaa);
                  auVar79 = vblendvps_avx(auVar85,auVar67,auVar86);
                  auVar67 = vblendvps_avx(auVar67,auVar85,auVar86);
                  *pauVar54 = auVar89;
                  pauVar54[1] = auVar67;
                  pauVar54[2] = auVar79;
                  uVar45 = auVar90._0_8_;
                  pauVar54 = pauVar54 + 3;
                }
                else {
                  *pauVar54 = auVar89;
                  pauVar54[1] = auVar67;
                  pauVar54[2] = auVar90;
                  pauVar43 = pauVar54 + 3;
                  pauVar54[3] = auVar85;
                  do {
                    lVar46 = 0;
                    if (uVar45 != 0) {
                      for (; (uVar45 >> lVar46 & 1) == 0; lVar46 = lVar46 + 1) {
                      }
                    }
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = *(ulong *)(uVar55 + lVar46 * 8);
                    auVar89 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_2560 + lVar46 * 4)));
                    pauVar43[1] = auVar89;
                    pauVar43 = pauVar43 + 1;
                    uVar45 = uVar45 & uVar45 - 1;
                  } while (uVar45 != 0);
                  lVar46 = 0;
                  while (pauVar43 != pauVar54) {
                    auVar89 = pauVar54[1];
                    uVar42 = vextractps_avx(auVar89,2);
                    for (lVar49 = 0x10;
                        (lVar46 != lVar49 && (*(uint *)(pauVar54[-1] + lVar49 + 8) < uVar42));
                        lVar49 = lVar49 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar54 + lVar49) =
                           *(undefined1 (*) [16])(pauVar54[-1] + lVar49);
                    }
                    *(undefined1 (*) [16])(*pauVar54 + lVar49) = auVar89;
                    lVar46 = lVar46 + -0x10;
                    pauVar54 = pauVar54 + 1;
                  }
                  uVar45 = *(ulong *)*pauVar43;
                  pauVar54 = pauVar43;
                }
              }
            }
          }
        }
        local_2608 = (ulong)((uint)uVar45 & 0xf) - 8;
        uVar45 = uVar45 & 0xfffffffffffffff0;
        lVar46 = 0;
        while (lVar46 != local_2608) {
          lVar49 = lVar46 * 0x50;
          pSVar50 = local_2648->scene;
          ppfVar6 = (pSVar50->vertices).items;
          pfVar7 = ppfVar6[*(uint *)(uVar45 + 0x30 + lVar49)];
          pfVar8 = ppfVar6[*(uint *)(uVar45 + 0x34 + lVar49)];
          pfVar9 = ppfVar6[*(uint *)(uVar45 + 0x38 + lVar49)];
          pfVar10 = ppfVar6[*(uint *)(uVar45 + 0x3c + lVar49)];
          auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + lVar49)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 8 + lVar49)));
          auVar89 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + lVar49)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar45 + 8 + lVar49)));
          auVar90 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 4 + lVar49)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar45 + 0xc + lVar49))
                                 );
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 4 + lVar49)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar45 + 0xc + lVar49))
                                 );
          auVar91 = vunpcklps_avx(auVar89,auVar67);
          auVar87 = vunpcklps_avx(auVar79,auVar90);
          auVar86 = vunpckhps_avx(auVar79,auVar90);
          auVar79 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x10 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar45 + 0x18 + lVar49)));
          auVar89 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x10 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar45 + 0x18 + lVar49)));
          auVar90 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x14 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar45 + 0x1c + lVar49)));
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x14 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar45 + 0x1c + lVar49)));
          auVar85 = vunpcklps_avx(auVar89,auVar67);
          auVar92 = vunpcklps_avx(auVar79,auVar90);
          auVar89 = vunpckhps_avx(auVar79,auVar90);
          auVar90 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x20 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar45 + 0x28 + lVar49)));
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar45 + 0x20 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar45 + 0x28 + lVar49)));
          auVar68 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x24 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar45 + 0x2c + lVar49)));
          auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar45 + 0x24 + lVar49))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar45 + 0x2c + lVar49)));
          auVar35 = vunpcklps_avx(auVar67,auVar79);
          auVar67 = vunpcklps_avx(auVar90,auVar68);
          auVar90 = vunpckhps_avx(auVar90,auVar68);
          puVar1 = (undefined8 *)(uVar45 + 0x30 + lVar49);
          local_2490 = *puVar1;
          uStack_2488 = puVar1[1];
          puVar1 = (undefined8 *)(uVar45 + 0x40 + lVar49);
          local_2570 = *puVar1;
          uStack_2568 = puVar1[1];
          local_2670 = vsubps_avx(auVar87,auVar92);
          auVar79 = vsubps_avx(auVar86,auVar89);
          local_2630 = auVar79;
          auVar89 = vsubps_avx(auVar91,auVar85);
          auVar67 = vsubps_avx(auVar67,auVar87);
          auVar90 = vsubps_avx(auVar90,auVar86);
          auVar85 = vsubps_avx(auVar35,auVar91);
          fVar66 = auVar85._0_4_;
          fVar114 = auVar79._0_4_;
          auVar57._0_4_ = fVar114 * fVar66;
          fVar15 = auVar85._4_4_;
          fVar117 = auVar79._4_4_;
          auVar57._4_4_ = fVar117 * fVar15;
          fVar21 = auVar85._8_4_;
          fVar118 = auVar79._8_4_;
          auVar57._8_4_ = fVar118 * fVar21;
          fVar27 = auVar85._12_4_;
          fVar119 = auVar79._12_4_;
          auVar57._12_4_ = fVar119 * fVar27;
          fVar99 = auVar90._0_4_;
          fVar94 = auVar89._0_4_;
          auVar69._0_4_ = fVar94 * fVar99;
          fVar16 = auVar90._4_4_;
          fVar96 = auVar89._4_4_;
          auVar69._4_4_ = fVar96 * fVar16;
          fVar22 = auVar90._8_4_;
          fVar97 = auVar89._8_4_;
          auVar69._8_4_ = fVar97 * fVar22;
          fVar28 = auVar90._12_4_;
          fVar98 = auVar89._12_4_;
          auVar69._12_4_ = fVar98 * fVar28;
          local_24d0 = vsubps_avx(auVar69,auVar57);
          fVar11 = auVar67._0_4_;
          auVar70._0_4_ = fVar94 * fVar11;
          fVar17 = auVar67._4_4_;
          auVar70._4_4_ = fVar96 * fVar17;
          fVar23 = auVar67._8_4_;
          auVar70._8_4_ = fVar97 * fVar23;
          fVar29 = auVar67._12_4_;
          auVar70._12_4_ = fVar98 * fVar29;
          fVar107 = local_2670._0_4_;
          auVar80._0_4_ = fVar107 * fVar66;
          fVar111 = local_2670._4_4_;
          auVar80._4_4_ = fVar111 * fVar15;
          fVar112 = local_2670._8_4_;
          auVar80._8_4_ = fVar112 * fVar21;
          fVar113 = local_2670._12_4_;
          auVar80._12_4_ = fVar113 * fVar27;
          local_24c0 = vsubps_avx(auVar80,auVar70);
          auVar81._0_4_ = fVar107 * fVar99;
          auVar81._4_4_ = fVar111 * fVar16;
          auVar81._8_4_ = fVar112 * fVar22;
          auVar81._12_4_ = fVar113 * fVar28;
          auVar88._0_4_ = fVar114 * fVar11;
          auVar88._4_4_ = fVar117 * fVar17;
          auVar88._8_4_ = fVar118 * fVar23;
          auVar88._12_4_ = fVar119 * fVar29;
          local_2680 = vsubps_avx(auVar88,auVar81);
          uVar44 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar58._4_4_ = uVar44;
          auVar58._0_4_ = uVar44;
          auVar58._8_4_ = uVar44;
          auVar58._12_4_ = uVar44;
          uVar44 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar108._4_4_ = uVar44;
          auVar108._0_4_ = uVar44;
          auVar108._8_4_ = uVar44;
          auVar108._12_4_ = uVar44;
          uVar44 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar115._4_4_ = uVar44;
          auVar115._0_4_ = uVar44;
          auVar115._8_4_ = uVar44;
          auVar115._12_4_ = uVar44;
          fVar56 = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_2640 = vsubps_avx(auVar87,auVar58);
          fVar64 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar89 = vsubps_avx(auVar86,auVar108);
          auVar67 = vsubps_avx(auVar91,auVar115);
          fVar12 = auVar67._0_4_;
          auVar109._0_4_ = fVar56 * fVar12;
          fVar18 = auVar67._4_4_;
          auVar109._4_4_ = fVar56 * fVar18;
          fVar24 = auVar67._8_4_;
          auVar109._8_4_ = fVar56 * fVar24;
          fVar30 = auVar67._12_4_;
          auVar109._12_4_ = fVar56 * fVar30;
          fVar13 = auVar89._0_4_;
          auVar116._0_4_ = fVar64 * fVar13;
          fVar19 = auVar89._4_4_;
          auVar116._4_4_ = fVar64 * fVar19;
          fVar25 = auVar89._8_4_;
          auVar116._8_4_ = fVar64 * fVar25;
          fVar31 = auVar89._12_4_;
          auVar116._12_4_ = fVar64 * fVar31;
          auVar67 = vsubps_avx(auVar116,auVar109);
          fVar65 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar14 = local_2640._0_4_;
          auVar59._0_4_ = fVar64 * fVar14;
          fVar20 = local_2640._4_4_;
          auVar59._4_4_ = fVar64 * fVar20;
          fVar26 = local_2640._8_4_;
          auVar59._8_4_ = fVar64 * fVar26;
          fVar32 = local_2640._12_4_;
          auVar59._12_4_ = fVar64 * fVar32;
          auVar71._0_4_ = fVar65 * fVar12;
          auVar71._4_4_ = fVar65 * fVar18;
          auVar71._8_4_ = fVar65 * fVar24;
          auVar71._12_4_ = fVar65 * fVar30;
          auVar90 = vsubps_avx(auVar71,auVar59);
          auVar72._0_4_ = fVar65 * fVar13;
          auVar72._4_4_ = fVar65 * fVar19;
          auVar72._8_4_ = fVar65 * fVar25;
          auVar72._12_4_ = fVar65 * fVar31;
          auVar82._0_4_ = fVar56 * fVar14;
          auVar82._4_4_ = fVar56 * fVar20;
          auVar82._8_4_ = fVar56 * fVar26;
          auVar82._12_4_ = fVar56 * fVar32;
          auVar85 = vsubps_avx(auVar82,auVar72);
          auVar86 = local_2680;
          auVar83._0_4_ =
               fVar65 * local_24d0._0_4_ + fVar56 * local_24c0._0_4_ + fVar64 * local_2680._0_4_;
          auVar83._4_4_ =
               fVar65 * local_24d0._4_4_ + fVar56 * local_24c0._4_4_ + fVar64 * local_2680._4_4_;
          auVar83._8_4_ =
               fVar65 * local_24d0._8_4_ + fVar56 * local_24c0._8_4_ + fVar64 * local_2680._8_4_;
          auVar83._12_4_ =
               fVar65 * local_24d0._12_4_ + fVar56 * local_24c0._12_4_ + fVar64 * local_2680._12_4_;
          auVar73._8_8_ = 0x8000000080000000;
          auVar73._0_8_ = 0x8000000080000000;
          auVar89 = vandps_avx(auVar83,auVar73);
          uVar42 = auVar89._0_4_;
          local_2560._0_4_ =
               (float)(uVar42 ^ (uint)(fVar11 * auVar67._0_4_ +
                                      fVar99 * auVar90._0_4_ + fVar66 * auVar85._0_4_));
          uVar101 = auVar89._4_4_;
          local_2560._4_4_ =
               (float)(uVar101 ^
                      (uint)(fVar17 * auVar67._4_4_ +
                            fVar16 * auVar90._4_4_ + fVar15 * auVar85._4_4_));
          uVar102 = auVar89._8_4_;
          local_2560._8_4_ =
               (float)(uVar102 ^
                      (uint)(fVar23 * auVar67._8_4_ +
                            fVar22 * auVar90._8_4_ + fVar21 * auVar85._8_4_));
          uVar103 = auVar89._12_4_;
          local_2560._12_4_ =
               (float)(uVar103 ^
                      (uint)(fVar29 * auVar67._12_4_ +
                            fVar28 * auVar90._12_4_ + fVar27 * auVar85._12_4_));
          local_2560._16_4_ =
               (float)(uVar42 ^ (uint)(auVar67._0_4_ * fVar107 +
                                      auVar90._0_4_ * fVar114 + fVar94 * auVar85._0_4_));
          local_2560._20_4_ =
               (float)(uVar101 ^
                      (uint)(auVar67._4_4_ * fVar111 +
                            auVar90._4_4_ * fVar117 + fVar96 * auVar85._4_4_));
          local_2560._24_4_ =
               (float)(uVar102 ^
                      (uint)(auVar67._8_4_ * fVar112 +
                            auVar90._8_4_ * fVar118 + fVar97 * auVar85._8_4_));
          local_2560._28_4_ =
               (float)(uVar103 ^
                      (uint)(auVar67._12_4_ * fVar113 +
                            auVar90._12_4_ * fVar119 + fVar98 * auVar85._12_4_));
          auVar90 = ZEXT416(0) << 0x20;
          auVar89 = vcmpps_avx(local_2560._0_16_,auVar90,5);
          auVar67 = vcmpps_avx(local_2560._16_16_,auVar90,5);
          auVar89 = vandps_avx(auVar89,auVar67);
          auVar74._8_4_ = 0x7fffffff;
          auVar74._0_8_ = 0x7fffffff7fffffff;
          auVar74._12_4_ = 0x7fffffff;
          local_2530 = vandps_avx(auVar83,auVar74);
          auVar67 = vcmpps_avx(auVar90,auVar83,4);
          auVar89 = vandps_avx(auVar89,auVar67);
          auVar75._0_4_ = local_2560._0_4_ + local_2560._16_4_;
          auVar75._4_4_ = local_2560._4_4_ + local_2560._20_4_;
          auVar75._8_4_ = local_2560._8_4_ + local_2560._24_4_;
          auVar75._12_4_ = local_2560._12_4_ + local_2560._28_4_;
          auVar67 = vcmpps_avx(auVar75,local_2530,2);
          auVar89 = vandps_avx(auVar89,auVar67);
          auVar35._8_8_ = uStack_2578;
          auVar35._0_8_ = local_2580;
          auVar35 = auVar35 & auVar89;
          local_2630._0_8_ = lVar46;
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar35[0xf] < '\0') {
            auVar41._8_8_ = uStack_2578;
            auVar41._0_8_ = local_2580;
            auVar89 = vandps_avx(auVar89,auVar41);
            local_2540._0_4_ =
                 (float)(uVar42 ^ (uint)(local_24d0._0_4_ * fVar14 +
                                        local_24c0._0_4_ * fVar13 + fVar12 * local_2680._0_4_));
            local_2540._4_4_ =
                 (float)(uVar101 ^
                        (uint)(local_24d0._4_4_ * fVar20 +
                              local_24c0._4_4_ * fVar19 + fVar18 * local_2680._4_4_));
            local_2540._8_4_ =
                 (float)(uVar102 ^
                        (uint)(local_24d0._8_4_ * fVar26 +
                              local_24c0._8_4_ * fVar25 + fVar24 * local_2680._8_4_));
            local_2540._12_4_ =
                 (float)(uVar103 ^
                        (uint)(local_24d0._12_4_ * fVar32 +
                              local_24c0._12_4_ * fVar31 + fVar30 * local_2680._12_4_));
            fVar56 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar64 = local_2530._0_4_;
            auVar60._0_4_ = fVar64 * fVar56;
            fVar65 = local_2530._4_4_;
            auVar60._4_4_ = fVar65 * fVar56;
            fVar66 = local_2530._8_4_;
            auVar60._8_4_ = fVar66 * fVar56;
            fVar99 = local_2530._12_4_;
            auVar60._12_4_ = fVar99 * fVar56;
            auVar67 = vcmpps_avx(auVar60,local_2540,1);
            fVar56 = (ray->super_RayK<1>).tfar;
            auVar76._0_4_ = fVar64 * fVar56;
            auVar76._4_4_ = fVar65 * fVar56;
            auVar76._8_4_ = fVar66 * fVar56;
            auVar76._12_4_ = fVar99 * fVar56;
            auVar90 = vcmpps_avx(local_2540,auVar76,2);
            auVar67 = vandps_avx(auVar90,auVar67);
            auVar90 = auVar89 & auVar67;
            if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar90[0xf] < '\0') {
              local_2670._0_8_ = pSVar50;
              local_2630._8_8_ = auVar79._8_8_;
              auVar3._0_4_ = (ray->super_RayK<1>).tfar;
              auVar3._4_4_ = (ray->super_RayK<1>).mask;
              auVar3._8_4_ = (ray->super_RayK<1>).id;
              auVar3._12_4_ = (ray->super_RayK<1>).flags;
              auVar93 = ZEXT1664(auVar3);
              auVar89 = vandps_avx(auVar89,auVar67);
              local_2510 = auVar89;
              local_24b0 = local_2680._0_8_;
              uStack_24a8 = local_2680._8_8_;
              local_2660 = auVar89;
              auVar67 = vrcpps_avx(local_2530);
              fVar56 = auVar67._0_4_;
              auVar77._0_4_ = fVar64 * fVar56;
              fVar64 = auVar67._4_4_;
              auVar77._4_4_ = fVar65 * fVar64;
              fVar65 = auVar67._8_4_;
              auVar77._8_4_ = fVar66 * fVar65;
              fVar66 = auVar67._12_4_;
              auVar77._12_4_ = fVar99 * fVar66;
              auVar84._8_4_ = 0x3f800000;
              auVar84._0_8_ = 0x3f8000003f800000;
              auVar84._12_4_ = 0x3f800000;
              auVar67 = vsubps_avx(auVar84,auVar77);
              fVar56 = fVar56 + fVar56 * auVar67._0_4_;
              fVar64 = fVar64 + fVar64 * auVar67._4_4_;
              fVar65 = fVar65 + fVar65 * auVar67._8_4_;
              fVar66 = fVar66 + fVar66 * auVar67._12_4_;
              local_24e0._0_4_ = fVar56 * local_2540._0_4_;
              local_24e0._4_4_ = fVar64 * local_2540._4_4_;
              local_24e0._8_4_ = fVar65 * local_2540._8_4_;
              local_24e0._12_4_ = fVar66 * local_2540._12_4_;
              auVar63 = ZEXT1664(local_24e0);
              local_2500[0] = fVar56 * local_2560._0_4_;
              local_2500[1] = fVar64 * local_2560._4_4_;
              local_2500[2] = fVar65 * local_2560._8_4_;
              local_2500[3] = fVar66 * local_2560._12_4_;
              local_24f0[0] = fVar56 * local_2560._16_4_;
              local_24f0[1] = fVar64 * local_2560._20_4_;
              local_24f0[2] = fVar65 * local_2560._24_4_;
              local_24f0[3] = fVar66 * local_2560._28_4_;
              auVar61._8_4_ = 0x7f800000;
              auVar61._0_8_ = 0x7f8000007f800000;
              auVar61._12_4_ = 0x7f800000;
              auVar67 = vblendvps_avx(auVar61,local_24e0,auVar89);
              auVar79 = vshufps_avx(auVar67,auVar67,0xb1);
              auVar79 = vminps_avx(auVar79,auVar67);
              auVar90 = vshufpd_avx(auVar79,auVar79,1);
              auVar79 = vminps_avx(auVar90,auVar79);
              auVar67 = vcmpps_avx(auVar67,auVar79,0);
              auVar79 = auVar89 & auVar67;
              if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar79[0xf] < '\0') {
                auVar89 = vandps_avx(auVar67,auVar89);
              }
              uVar42 = vextractps_avx(auVar3,1);
              uVar44 = vmovmskps_avx(auVar89);
              uVar55 = CONCAT44((int)((ulong)pfVar10 >> 0x20),uVar44);
              local_2610 = 0;
              local_2680 = auVar86;
              if (uVar55 != 0) {
                for (; (uVar55 >> local_2610 & 1) == 0; local_2610 = local_2610 + 1) {
                }
              }
LAB_00e548e2:
              local_25a0 = auVar93._0_16_;
              local_2590 = auVar63._0_16_;
              local_25b8 = *(uint *)((long)&local_2490 + local_2610 * 4);
              pGVar47 = (Geometry *)(ulong)local_25b8;
              local_2618 = (pSVar50->geometries).items[(long)pGVar47].ptr;
              if ((local_2618->mask & uVar42) == 0) {
                *(undefined4 *)(local_2660 + local_2610 * 4) = 0;
              }
              else {
                if (local_2648->args->filter == (RTCFilterFunctionN)0x0) {
                  local_2600.context = local_2648->user;
                  if (local_2618->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar56 = local_2500[local_2610];
                    fVar64 = local_24f0[local_2610];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + local_2610 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24d0 + local_2610 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_24c0 + local_2610 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)((long)&local_24b0 + local_2610 * 4);
                    ray->u = fVar56;
                    ray->v = fVar64;
                    ray->primID = *(uint *)((long)&local_2570 + local_2610 * 4);
                    ray->geomID = local_25b8;
                    ray->instID[0] = (local_2600.context)->instID[0];
                    ray->instPrimID[0] = (local_2600.context)->instPrimID[0];
                    goto LAB_00e54749;
                  }
                }
                else {
                  local_2600.context = local_2648->user;
                }
                local_2640._0_8_ = uVar52;
                local_2680._0_8_ = local_2648->args;
                local_25d0 = *(float *)(local_24d0 + local_2610 * 4);
                local_25cc = *(undefined4 *)(local_24c0 + local_2610 * 4);
                local_25c8 = *(undefined4 *)((long)&local_24b0 + local_2610 * 4);
                local_25c4 = local_2500[local_2610];
                local_25c0 = local_24f0[local_2610];
                local_25bc = *(undefined4 *)((long)&local_2570 + local_2610 * 4);
                local_25b4 = (local_2600.context)->instID[0];
                local_25b0 = (local_2600.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = *(float *)(local_24e0 + local_2610 * 4);
                local_2684 = -1;
                local_2600.valid = &local_2684;
                pGVar47 = (Geometry *)local_2618->userPtr;
                local_2600.geometryUserPtr = pGVar47;
                local_2600.ray = (RTCRayN *)ray;
                local_2600.hit = (RTCHitN *)&local_25d0;
                local_2600.N = 1;
                if ((local_2618->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*local_2618->intersectionFilterN)(&local_2600), *local_2600.valid != 0)) {
                  if ((*(Device **)(local_2680._0_8_ + 0x10) != (Device *)0x0) &&
                     (((pGVar47 = (Geometry *)local_2680._0_8_,
                       ((ulong)((RefCount *)local_2680._0_8_)->_vptr_RefCount & 2) != 0 ||
                       (pGVar47 = local_2618, ((local_2618->field_8).field_0x2 & 0x40) != 0)) &&
                      ((*(code *)*(Device **)(local_2680._0_8_ + 0x10))(&local_2600),
                      *local_2600.valid == 0)))) goto LAB_00e54b60;
                  (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_2600.hit;
                  (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_2600.hit + 4);
                  (((Vec3f *)((long)local_2600.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_2600.hit + 8);
                  *(float *)((long)local_2600.ray + 0x3c) = *(float *)(local_2600.hit + 0xc);
                  *(float *)((long)local_2600.ray + 0x40) = *(float *)(local_2600.hit + 0x10);
                  *(float *)((long)local_2600.ray + 0x44) = *(float *)(local_2600.hit + 0x14);
                  *(float *)((long)local_2600.ray + 0x48) = *(float *)(local_2600.hit + 0x18);
                  *(float *)((long)local_2600.ray + 0x4c) = *(float *)(local_2600.hit + 0x1c);
                  pGVar47 = (Geometry *)0x0;
                  *(float *)((long)local_2600.ray + 0x50) = *(float *)(local_2600.hit + 0x20);
                }
                else {
LAB_00e54b60:
                  (ray->super_RayK<1>).tfar = (float)local_25a0._0_4_;
                }
                *(undefined4 *)(local_2660 + local_2610 * 4) = 0;
                fVar56 = (ray->super_RayK<1>).tfar;
                auVar62._4_4_ = fVar56;
                auVar62._0_4_ = fVar56;
                auVar62._8_4_ = fVar56;
                auVar62._12_4_ = fVar56;
                auVar63 = ZEXT1664(local_2590);
                auVar89 = vcmpps_avx(local_2590,auVar62,2);
                local_2660 = vandps_avx(auVar89,local_2660);
                auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                auVar4._4_4_ = (ray->super_RayK<1>).mask;
                auVar4._8_4_ = (ray->super_RayK<1>).id;
                auVar4._12_4_ = (ray->super_RayK<1>).flags;
                auVar93 = ZEXT1664(auVar4);
                uVar42 = vextractps_avx(auVar4,1);
                pSVar50 = (Scene *)local_2670._0_8_;
                uVar52 = local_2640._0_8_;
              }
              if ((((local_2660 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2660 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2660 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2660[0xf]) goto LAB_00e54749;
              auVar78._8_4_ = 0x7f800000;
              auVar78._0_8_ = 0x7f8000007f800000;
              auVar78._12_4_ = 0x7f800000;
              auVar89 = vblendvps_avx(auVar78,auVar63._0_16_,local_2660);
              auVar67 = vshufps_avx(auVar89,auVar89,0xb1);
              auVar67 = vminps_avx(auVar67,auVar89);
              auVar79 = vshufpd_avx(auVar67,auVar67,1);
              auVar67 = vminps_avx(auVar79,auVar67);
              auVar67 = vcmpps_avx(auVar89,auVar67,0);
              auVar79 = local_2660 & auVar67;
              auVar89 = local_2660;
              if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar79[0xf] < '\0') {
                auVar89 = vandps_avx(auVar67,local_2660);
              }
              uVar44 = vmovmskps_avx(auVar89);
              uVar55 = CONCAT44((int)((ulong)pGVar47 >> 0x20),uVar44);
              local_2610 = 0;
              if (uVar55 != 0) {
                for (; (uVar55 >> local_2610 & 1) == 0; local_2610 = local_2610 + 1) {
                }
              }
              goto LAB_00e548e2;
            }
          }
LAB_00e54749:
          auVar93 = ZEXT3264(local_23c0);
          auVar95 = ZEXT3264(local_23e0);
          auVar100 = ZEXT3264(local_2400);
          auVar104 = ZEXT3264(local_2420);
          auVar105 = ZEXT3264(local_2440);
          auVar106 = ZEXT3264(local_2460);
          auVar110 = ZEXT3264(local_2480);
          lVar46 = local_2630._0_8_ + 1;
        }
        fVar56 = (ray->super_RayK<1>).tfar;
        auVar63 = ZEXT3264(CONCAT428(fVar56,CONCAT424(fVar56,CONCAT420(fVar56,CONCAT416(fVar56,
                                                  CONCAT412(fVar56,CONCAT48(fVar56,CONCAT44(fVar56,
                                                  fVar56))))))));
      }
      goto LAB_00e54122;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }